

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::VisitDescriptorsTest_AllTypesDeduceDelegate_Test::TestBody
          (VisitDescriptorsTest_AllTypesDeduceDelegate_Test *this)

{
  FileDescriptor *this_00;
  Descriptor *pDVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  EnumDescriptor *descriptor;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_01;
  ServiceDescriptor *this_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *pVVar2;
  char **in_RCX;
  UnorderedElementsAreArrayMatcher<const_char_*> *matcher;
  int i;
  int iVar3;
  char *message;
  int i_4;
  int index;
  AssertHelper local_1a8;
  char *local_1a0;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<const_char_*>_>
  local_198;
  AssertionResult gtest_ar;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  descriptors;
  UnorderedElementsAreArrayMatcher<const_char_*> local_148;
  FileDescriptorProto proto;
  
  pDVar1 = proto2_unittest::TestAllTypes::GetDescriptor();
  this_00 = pDVar1->file_;
  FileDescriptorProto::FileDescriptorProto(&proto);
  FileDescriptor::CopyTo(this_00,&proto);
  local_198.matcher_._0_8_ = &descriptors;
  descriptors.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptors.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  descriptors.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (iVar3 = 0; iVar3 < this_00->message_type_count_; iVar3 = iVar3 + 1) {
    pDVar1 = FileDescriptor::message_type(this_00,iVar3);
    proto_00 = internal::RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&proto.field_0._impl_.message_type_.super_RepeatedPtrFieldBase,iVar3);
    internal::
    VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_visitor_test.cc:132:20)>_>
    ::Visit<google::protobuf::DescriptorProto>
              ((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_visitor_test_cc:132:20)>_>
                *)&local_198,pDVar1,proto_00);
  }
  for (iVar3 = 0; iVar3 < this_00->enum_type_count_; iVar3 = iVar3 + 1) {
    descriptor = FileDescriptor::enum_type(this_00,iVar3);
    proto_01 = internal::RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                         (&proto.field_0._impl_.enum_type_.super_RepeatedPtrFieldBase,iVar3);
    internal::
    VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_visitor_test.cc:132:20)>_>
    ::Visit<google::protobuf::EnumDescriptorProto>
              ((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_visitor_test_cc:132:20)>_>
                *)&local_198,descriptor,proto_01);
  }
  for (iVar3 = 0; iVar3 < this_00->extension_count_; iVar3 = iVar3 + 1) {
    FileDescriptor::extension(this_00,iVar3);
    internal::RepeatedPtrFieldBase::
    Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
              (&proto.field_0._impl_.extension_.super_RepeatedPtrFieldBase,iVar3);
  }
  for (iVar3 = 0; iVar3 < this_00->service_count_; iVar3 = iVar3 + 1) {
    this_01 = FileDescriptor::service(this_00,iVar3);
    pVVar2 = internal::RepeatedPtrFieldBase::
             Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                       (&proto.field_0._impl_.service_.super_RepeatedPtrFieldBase,iVar3);
    for (index = 0; index < this_01->method_count_; index = index + 1) {
      ServiceDescriptor::method(this_01,index);
      internal::RepeatedPtrFieldBase::
      Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                (&(pVVar2->field_0)._impl_.method_.super_RepeatedPtrFieldBase,index);
    }
  }
  local_1a8.data_ = (AssertHelperData *)0xe86f61;
  local_1a0 = "proto2_unittest.TestSparseEnum";
  testing::IsSupersetOf<char_const*const*>
            (&local_148,(testing *)&local_1a8,(char **)&local_198,in_RCX);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<char_const*>>
            (&local_198,(internal *)&local_148,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<char_const*>>::
  operator()(&gtest_ar,(char *)&local_198,
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0xf7d9d1);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&local_198.matcher_.matchers_.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&local_148.matchers_.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_198);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_visitor_test.cc"
               ,0x8a,message);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_198.matcher_._0_8_ !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_198.matcher_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&descriptors.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  FileDescriptorProto::~FileDescriptorProto(&proto);
  return;
}

Assistant:

TEST(VisitDescriptorsTest, AllTypesDeduceDelegate) {
  const FileDescriptor& file =
      *proto2_unittest::TestAllTypes::GetDescriptor()->file();
  FileDescriptorProto proto;
  file.CopyTo(&proto);
  std::vector<absl::string_view> descriptors;

  VisitDescriptors(file, proto,
                   [&](const auto& descriptor, const auto& proto)
                       -> decltype(TestHandle(descriptor, proto, nullptr)) {
                     TestHandle(descriptor, proto, &descriptors);
                   });

  EXPECT_THAT(descriptors, IsSupersetOf({"proto2_unittest.TestAllTypes",
                                         "proto2_unittest.TestSparseEnum"}));
}